

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallRuntimeDependencySetGenerator::GenerateScriptForConfig
          (cmInstallRuntimeDependencySetGenerator *this,ostream *os,string *config,Indent indent)

{
  cmMakefile *pcVar1;
  size_type sVar2;
  pointer pbVar3;
  char *__s;
  bool bVar4;
  string *psVar5;
  ostream *poVar6;
  string *__lhs;
  cmake *this_00;
  WrapQuotes wrapQuotes;
  pointer pbVar7;
  cmScriptGeneratorIndent indent_00;
  string_view str;
  string installNameDir;
  string result_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  evaluatedRPaths;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar1 = this->LocalGenerator->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&installNameDir,"CMAKE_INSTALL_NAME_TOOL",(allocator<char> *)&result_1);
  psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&installNameDir);
  if (psVar5->_M_string_length == 0) {
LAB_0031ab93:
    std::__cxx11::string::~string((string *)&installNameDir);
  }
  else {
    bVar4 = this->NoInstallName;
    std::__cxx11::string::~string((string *)&installNameDir);
    if (bVar4 == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&installNameDir,"@rpath/",(allocator<char> *)&result_1);
      if ((this->InstallNameDir)._M_string_length != 0) {
        std::__cxx11::string::_M_assign((string *)&installNameDir);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&result_1,"${CMAKE_INSTALL_PREFIX}",(allocator<char> *)&evaluatedRPaths
                  );
        cmGeneratorExpression::ReplaceInstallPrefix(&installNameDir,&result_1);
        std::__cxx11::string::~string((string *)&result_1);
        std::__cxx11::string::string((string *)&local_90,(string *)&installNameDir);
        evaluatedRPaths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&evaluatedRPaths.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        evaluatedRPaths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        evaluatedRPaths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)evaluatedRPaths.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage &
                      0xffffffffffffff00);
        cmGeneratorExpression::Evaluate
                  (&result_1,&local_90,this->LocalGenerator,config,(cmGeneratorTarget *)0x0,
                   (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,
                   (string *)&evaluatedRPaths);
        std::__cxx11::string::operator=((string *)&installNameDir,(string *)&result_1);
        std::__cxx11::string::~string((string *)&result_1);
        std::__cxx11::string::~string((string *)&evaluatedRPaths);
        std::__cxx11::string::~string((string *)&local_90);
        if (installNameDir._M_string_length == 0) {
          this_00 = cmMakefile::GetCMakeInstance(this->LocalGenerator->Makefile);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result_1,
                     "INSTALL_NAME_DIR argument must not evaluate to an empty string",
                     (allocator<char> *)&evaluatedRPaths);
          cmake::IssueMessage(this_00,FATAL_ERROR,&result_1,
                              &(this->super_cmInstallGenerator).Backtrace);
          std::__cxx11::string::~string((string *)&result_1);
          std::__cxx11::string::~string((string *)&installNameDir);
          return;
        }
        if (installNameDir._M_dataplus._M_p[installNameDir._M_string_length - 1] != '/') {
          std::__cxx11::string::push_back((char)&installNameDir);
        }
      }
      poVar6 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
      poVar6 = std::operator<<(poVar6,"set(");
      poVar6 = std::operator<<(poVar6,this->TmpVarPrefix);
      poVar6 = std::operator<<(poVar6,"_install_name_dir \"");
      poVar6 = std::operator<<(poVar6,(string *)&installNameDir);
      std::operator<<(poVar6,"\")\n");
      goto LAB_0031ab93;
    }
  }
  poVar6 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
  poVar6 = std::operator<<(poVar6,"foreach(");
  poVar6 = std::operator<<(poVar6,this->TmpVarPrefix);
  poVar6 = std::operator<<(poVar6,"_dep IN LISTS ");
  poVar6 = std::operator<<(poVar6,this->DepsVar);
  std::operator<<(poVar6,")\n");
  pcVar1 = this->LocalGenerator->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&installNameDir,"CMAKE_INSTALL_NAME_TOOL",(allocator<char> *)&result_1);
  psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&installNameDir);
  sVar2 = psVar5->_M_string_length;
  std::__cxx11::string::~string((string *)&installNameDir);
  if (sVar2 != 0) {
    evaluatedRPaths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    evaluatedRPaths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    evaluatedRPaths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pbVar3 = (this->InstallRPaths).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar7 = (this->InstallRPaths).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar3; pbVar7 = pbVar7 + 1)
    {
      std::__cxx11::string::string((string *)&local_50,(string *)pbVar7);
      result_1._M_string_length = 0;
      result_1.field_2._M_allocated_capacity =
           result_1.field_2._M_allocated_capacity & 0xffffffffffffff00;
      result_1._M_dataplus._M_p = (pointer)&result_1.field_2;
      cmGeneratorExpression::Evaluate
                (&installNameDir,&local_50,this->LocalGenerator,config,(cmGeneratorTarget *)0x0,
                 (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&result_1);
      std::__cxx11::string::~string((string *)&result_1);
      std::__cxx11::string::~string((string *)&local_50);
      if (installNameDir._M_string_length != 0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &evaluatedRPaths,&installNameDir);
      }
      std::__cxx11::string::~string((string *)&installNameDir);
    }
    if (this->Type == Library) {
      GenerateAppleLibraryScript(this,os,config,&evaluatedRPaths,(Indent)(indent.Level + 2));
    }
    else if (this->Type == Framework) {
      GenerateAppleFrameworkScript(this,os,config,&evaluatedRPaths,(Indent)(indent.Level + 2));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&evaluatedRPaths);
    goto LAB_0031b26b;
  }
  __s = this->TmpVarPrefix;
  installNameDir._M_dataplus._M_p = (pointer)strlen(__s);
  result_1._M_dataplus._M_p = (pointer)0x4;
  result_1._M_string_length = (size_type)anon_var_dwarf_fdb328;
  installNameDir._M_string_length = (size_type)__s;
  cmStrCat<>((string *)&evaluatedRPaths,(cmAlphaNum *)&installNameDir,(cmAlphaNum *)&result_1);
  GetDestination(&installNameDir,this,config);
  psVar5 = &result_1;
  result_1.field_2._M_allocated_capacity = 0;
  result_1._M_dataplus._M_p = (pointer)0x0;
  result_1._M_string_length = 0;
  indent_00.Level = indent.Level + 2;
  cmInstallGenerator::AddInstallRule
            (&this->super_cmInstallGenerator,os,&installNameDir,cmInstallType_SHARED_LIBRARY,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)psVar5,false,(this->Permissions)._M_dataplus._M_p,(char *)0x0,(char *)0x0,
             " FOLLOW_SYMLINK_CHAIN",(Indent)indent_00.Level,
             (char *)evaluatedRPaths.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&result_1);
  std::__cxx11::string::~string((string *)&installNameDir);
  pcVar1 = this->LocalGenerator->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&installNameDir,"CMAKE_SYSTEM_NAME",(allocator<char> *)&result_1);
  __lhs = cmMakefile::GetSafeDefinition(pcVar1,&installNameDir);
  bVar4 = std::operator==(__lhs,"Linux");
  if (bVar4) {
    bVar4 = this->NoInstallRPath;
    std::__cxx11::string::~string((string *)&installNameDir);
    if (bVar4 == false) {
      installNameDir._M_dataplus._M_p = (pointer)&installNameDir.field_2;
      installNameDir._M_string_length = 0;
      installNameDir.field_2._M_local_buf[0] = '\0';
      pbVar3 = (this->InstallRPaths).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar7 = (this->InstallRPaths).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; wrapQuotes = (WrapQuotes)psVar5,
          pbVar7 != pbVar3; pbVar7 = pbVar7 + 1) {
        std::__cxx11::string::string((string *)&local_70,(string *)pbVar7);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        local_f0._M_string_length = 0;
        local_f0.field_2._M_local_buf[0] = '\0';
        psVar5 = (string *)0x0;
        cmGeneratorExpression::Evaluate
                  (&result_1,&local_70,this->LocalGenerator,config,(cmGeneratorTarget *)0x0,
                   (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_70);
        if (result_1._M_string_length != 0) {
          if (installNameDir._M_string_length == 0) {
            std::__cxx11::string::operator=((string *)&installNameDir,(string *)&result_1);
          }
          else {
            std::__cxx11::string::push_back((char)&installNameDir);
            std::__cxx11::string::append((string *)&installNameDir);
          }
        }
        std::__cxx11::string::~string((string *)&result_1);
      }
      poVar6 = operator<<(os,indent_00);
      poVar6 = std::operator<<(poVar6,"get_filename_component(");
      poVar6 = std::operator<<(poVar6,this->TmpVarPrefix);
      poVar6 = std::operator<<(poVar6,"_dep_name \"${");
      poVar6 = std::operator<<(poVar6,this->TmpVarPrefix);
      std::operator<<(poVar6,"_dep}\" NAME)\n");
      if (installNameDir._M_string_length == 0) {
        poVar6 = operator<<(os,indent_00);
        poVar6 = std::operator<<(poVar6,"file(RPATH_REMOVE FILE \"");
        GetDestination(&local_d0,this,config);
        cmInstallGenerator::ConvertToAbsoluteDestination(&local_f0,&local_d0);
        cmInstallGenerator::GetDestDirPath(&result_1,&local_f0);
        poVar6 = std::operator<<(poVar6,(string *)&result_1);
        poVar6 = std::operator<<(poVar6,"/${");
        poVar6 = std::operator<<(poVar6,this->TmpVarPrefix);
        std::operator<<(poVar6,"_dep_name}\")\n");
      }
      else {
        poVar6 = operator<<(os,indent_00);
        poVar6 = std::operator<<(poVar6,"file(RPATH_SET FILE \"");
        GetDestination(&local_d0,this,config);
        cmInstallGenerator::ConvertToAbsoluteDestination(&local_f0,&local_d0);
        cmInstallGenerator::GetDestDirPath(&result_1,&local_f0);
        poVar6 = std::operator<<(poVar6,(string *)&result_1);
        poVar6 = std::operator<<(poVar6,"/${");
        poVar6 = std::operator<<(poVar6,this->TmpVarPrefix);
        poVar6 = std::operator<<(poVar6,"_dep_name}\" NEW_RPATH ");
        str._M_str = (char *)0x0;
        str._M_len = (size_t)installNameDir._M_dataplus._M_p;
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  (&local_b0,(cmOutputConverter *)installNameDir._M_string_length,str,wrapQuotes);
        poVar6 = std::operator<<(poVar6,(string *)&local_b0);
        std::operator<<(poVar6,")\n");
        std::__cxx11::string::~string((string *)&local_b0);
      }
      std::__cxx11::string::~string((string *)&result_1);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
      goto LAB_0031b254;
    }
  }
  else {
LAB_0031b254:
    std::__cxx11::string::~string((string *)&installNameDir);
  }
  std::__cxx11::string::~string((string *)&evaluatedRPaths);
LAB_0031b26b:
  poVar6 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
  std::operator<<(poVar6,"endforeach()\n");
  return;
}

Assistant:

void cmInstallRuntimeDependencySetGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  if (!this->LocalGenerator->GetMakefile()
         ->GetSafeDefinition("CMAKE_INSTALL_NAME_TOOL")
         .empty() &&
      !this->NoInstallName) {
    std::string installNameDir = "@rpath/";
    if (!this->InstallNameDir.empty()) {
      installNameDir = this->InstallNameDir;
      cmGeneratorExpression::ReplaceInstallPrefix(installNameDir,
                                                  "${CMAKE_INSTALL_PREFIX}");
      installNameDir = cmGeneratorExpression::Evaluate(
        installNameDir, this->LocalGenerator, config);
      if (installNameDir.empty()) {
        this->LocalGenerator->GetMakefile()->GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR,
          "INSTALL_NAME_DIR argument must not evaluate to an "
          "empty string",
          this->Backtrace);
        return;
      }
      if (installNameDir.back() != '/') {
        installNameDir += '/';
      }
    }
    os << indent << "set(" << this->TmpVarPrefix << "_install_name_dir \""
       << installNameDir << "\")\n";
  }

  os << indent << "foreach(" << this->TmpVarPrefix << "_dep IN LISTS "
     << this->DepsVar << ")\n";

  if (!this->LocalGenerator->GetMakefile()
         ->GetSafeDefinition("CMAKE_INSTALL_NAME_TOOL")
         .empty()) {
    std::vector<std::string> evaluatedRPaths;
    for (auto const& rpath : this->InstallRPaths) {
      std::string result =
        cmGeneratorExpression::Evaluate(rpath, this->LocalGenerator, config);
      if (!result.empty()) {
        evaluatedRPaths.push_back(std::move(result));
      }
    }

    switch (this->Type) {
      case DependencyType::Library:
        this->GenerateAppleLibraryScript(os, config, evaluatedRPaths,
                                         indent.Next());
        break;
      case DependencyType::Framework:
        this->GenerateAppleFrameworkScript(os, config, evaluatedRPaths,
                                           indent.Next());
        break;
    }
  } else {
    std::string depVar = cmStrCat(this->TmpVarPrefix, "_dep");

    this->AddInstallRule(
      os, this->GetDestination(config), cmInstallType_SHARED_LIBRARY, {},
      false, this->Permissions.c_str(), nullptr, nullptr,
      " FOLLOW_SYMLINK_CHAIN", indent.Next(), depVar.c_str());

    if (this->LocalGenerator->GetMakefile()->GetSafeDefinition(
          "CMAKE_SYSTEM_NAME") == "Linux" &&
        !this->NoInstallRPath) {
      std::string evaluatedRPath;
      for (auto const& rpath : this->InstallRPaths) {
        std::string result =
          cmGeneratorExpression::Evaluate(rpath, this->LocalGenerator, config);
        if (!result.empty()) {
          if (evaluatedRPath.empty()) {
            evaluatedRPath = std::move(result);
          } else {
            evaluatedRPath += ':';
            evaluatedRPath += result;
          }
        }
      }

      os << indent.Next() << "get_filename_component(" << this->TmpVarPrefix
         << "_dep_name \"${" << this->TmpVarPrefix << "_dep}\" NAME)\n";
      if (evaluatedRPath.empty()) {
        os << indent.Next() << "file(RPATH_REMOVE FILE \""
           << GetDestDirPath(
                ConvertToAbsoluteDestination(this->GetDestination(config)))
           << "/${" << this->TmpVarPrefix << "_dep_name}\")\n";
      } else {
        os << indent.Next() << "file(RPATH_SET FILE \""
           << GetDestDirPath(
                ConvertToAbsoluteDestination(this->GetDestination(config)))
           << "/${" << this->TmpVarPrefix << "_dep_name}\" NEW_RPATH "
           << cmOutputConverter::EscapeForCMake(evaluatedRPath) << ")\n";
      }
    }
  }

  os << indent << "endforeach()\n";
}